

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error storeEntityValue(XML_Parser parser,ENCODING *enc,char *entityTextPtr,char *entityTextEnd)

{
  STRING_POOL *pool;
  char cVar1;
  char *pcVar2;
  undefined1 *puVar3;
  int iVar4;
  uint uVar5;
  XML_Error XVar6;
  XML_Char *pXVar7;
  NAMED *pNVar8;
  ulong uVar9;
  bool bVar10;
  char *next;
  XML_Char buf [4];
  XML_Error local_5c;
  char *local_58;
  char local_4c [4];
  char *local_48;
  HASH_TABLE *local_40;
  STRING_POOL *local_38;
  
  pool = (STRING_POOL *)((long)parser + 0x330);
  local_38 = (STRING_POOL *)((long)parser + 0x418);
  local_40 = (HASH_TABLE *)((long)parser + 0x368);
  do {
    iVar4 = (*enc->literalScanners[1])(enc,entityTextPtr,entityTextEnd,&local_58);
    switch(iVar4) {
    case 0:
      local_5c = XML_ERROR_INVALID_TOKEN;
      if (*(ENCODING **)((long)parser + 0x118) == enc) {
        *(char **)((long)parser + 0x218) = local_58;
      }
      break;
    case 6:
    case 9:
      pXVar7 = poolAppend(pool,enc,entityTextPtr,local_58);
      if (pXVar7 == (XML_Char *)0x0) goto LAB_004ccf4c;
      goto LAB_004cd012;
    case 10:
      iVar4 = (*enc->charRefNumber)(enc,entityTextPtr);
      if ((iVar4 < 0) || (uVar5 = cm_expat_XmlUtf8Encode(iVar4,local_4c), uVar5 == 0)) {
        if (*(ENCODING **)((long)parser + 0x118) == enc) {
          *(char **)((long)parser + 0x218) = entityTextPtr;
        }
        local_5c = XML_ERROR_BAD_CHAR_REF;
LAB_004ccfc8:
        bVar10 = false;
      }
      else {
        bVar10 = true;
        if (0 < (int)uVar5) {
          local_48 = entityTextEnd;
          uVar9 = 0;
          do {
            if ((*(long *)((long)parser + 0x340) == *(long *)((long)parser + 0x348)) &&
               (iVar4 = poolGrow(pool), iVar4 == 0)) {
              local_5c = XML_ERROR_NO_MEMORY;
              bVar10 = false;
              entityTextEnd = local_48;
              goto LAB_004cd00e;
            }
            cVar1 = local_4c[uVar9];
            pcVar2 = *(char **)((long)parser + 0x348);
            *(char **)((long)parser + 0x348) = pcVar2 + 1;
            *pcVar2 = cVar1;
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
          bVar10 = true;
          entityTextEnd = local_48;
        }
      }
LAB_004cd00e:
      if (bVar10) goto LAB_004cd012;
      break;
    case -4:
      local_5c = XML_ERROR_NONE;
      break;
    case -3:
      local_58 = entityTextPtr + enc->minBytesPerChar;
    case 7:
      if ((*(long *)((long)parser + 0x340) == *(long *)((long)parser + 0x348)) &&
         (iVar4 = poolGrow(pool), iVar4 == 0)) {
LAB_004ccf4c:
        local_5c = XML_ERROR_NO_MEMORY;
        break;
      }
      puVar3 = *(undefined1 **)((long)parser + 0x348);
      *(undefined1 **)((long)parser + 0x348) = puVar3 + 1;
      *puVar3 = 10;
LAB_004cd012:
      bVar10 = true;
      entityTextPtr = local_58;
      goto LAB_004cd01d;
    case -2:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 8:
switchD_004ccdbe_caseD_fffffffe:
      local_5c = XML_ERROR_UNEXPECTED_STATE;
      goto LAB_004ccf94;
    case -1:
      local_5c = XML_ERROR_INVALID_TOKEN;
LAB_004ccf94:
      if (*(ENCODING **)((long)parser + 0x118) == enc) {
        *(char **)((long)parser + 0x218) = entityTextPtr;
      }
      break;
    default:
      if (iVar4 != 0x1c) goto switchD_004ccdbe_caseD_fffffffe;
      if ((*(long *)((long)parser + 0x490) != 0) || (*(ENCODING **)((long)parser + 0x118) != enc)) {
        pXVar7 = poolStoreString(local_38,enc,entityTextPtr + enc->minBytesPerChar,
                                 local_58 + -(long)enc->minBytesPerChar);
        if (pXVar7 == (XML_Char *)0x0) {
          local_5c = XML_ERROR_NO_MEMORY;
          goto LAB_004ccfc8;
        }
        pNVar8 = lookup(local_40,pXVar7,0);
        *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
        if (pNVar8 == (NAMED *)0x0) {
          local_5c = XML_ERROR_UNDEFINED_ENTITY;
        }
        else if (*(char *)&pNVar8[7].name == '\0') {
          if (pNVar8[3].name == (KEY)0x0) {
            *(undefined1 *)&pNVar8[7].name = 1;
            XVar6 = storeEntityValue(parser,*(ENCODING **)((long)parser + 0x1b8),pNVar8[1].name,
                                     pNVar8[1].name + *(int *)&pNVar8[2].name);
            *(undefined1 *)&pNVar8[7].name = 0;
            bVar10 = XVar6 == XML_ERROR_NONE;
            if (!bVar10) {
              local_5c = XVar6;
            }
            goto LAB_004cd00e;
          }
          local_5c = XML_ERROR_PARAM_ENTITY_REF;
        }
        else {
          local_5c = XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (*(ENCODING **)((long)parser + 0x118) == enc) {
          *(char **)((long)parser + 0x218) = entityTextPtr;
        }
        bVar10 = false;
        goto LAB_004cd00e;
      }
      *(char **)((long)parser + 0x218) = entityTextPtr;
      local_5c = XML_ERROR_SYNTAX;
    }
    bVar10 = false;
LAB_004cd01d:
    if (!bVar10) {
      return local_5c;
    }
  } while( true );
}

Assistant:

static
enum XML_Error storeEntityValue(XML_Parser parser,
                                const ENCODING *enc,
                                const char *entityTextPtr,
                                const char *entityTextEnd)
{
  STRING_POOL *pool = &(dtd.pool);
  for (;;) {
    const char *next;
    int tok = XmlEntityValueTok(enc, entityTextPtr, entityTextEnd, &next);
    switch (tok) {
    case XML_TOK_PARAM_ENTITY_REF:
#ifdef XML_DTD
      if (parentParser || enc != encoding) {
        enum XML_Error result;
        const XML_Char *name;
        ENTITY *entity;
        name = poolStoreString(&tempPool, enc,
                               entityTextPtr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.paramEntities, name, 0);
        poolDiscard(&tempPool);
        if (!entity) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_UNDEFINED_ENTITY;
        }
        if (entity->open) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->systemId) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_PARAM_ENTITY_REF;
        }
        entity->open = 1;
        result = storeEntityValue(parser,
                                  internalEncoding,
                                  (char *)entity->textPtr,
                                  (char *)(entity->textPtr + entity->textLen));
        entity->open = 0;
        if (result)
          return result;
        break;
      }
#endif /* XML_DTD */
      eventPtr = entityTextPtr;
      return XML_ERROR_SYNTAX;
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_ENTITY_REF:
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, entityTextPtr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = entityTextPtr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_DATA_NEWLINE:
      if (pool->end == pool->ptr && !poolGrow(pool))
        return XML_ERROR_NO_MEMORY;
      *(pool->ptr)++ = 0xA;
      break;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, entityTextPtr);
        if (n < 0) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        n = XmlEncode(n, (ICHAR *)buf);
        if (!n) {
          if (enc == encoding)
            eventPtr = entityTextPtr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (i = 0; i < n; i++) {
          if (pool->end == pool->ptr && !poolGrow(pool))
            return XML_ERROR_NO_MEMORY;
          *(pool->ptr)++ = buf[i];
        }
      }
      break;
    case XML_TOK_PARTIAL:
      if (enc == encoding)
        eventPtr = entityTextPtr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_INVALID:
      if (enc == encoding)
        eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    default:
      if (enc == encoding)
        eventPtr = entityTextPtr;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    entityTextPtr = next;
  }
  /* not reached */
}